

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

SolveStrategy *
Clasp::ClaspFacade::SolveStrategy::create(SolveMode_t m,ClaspFacade *f,SolveAlgorithm *algo)

{
  Async *this;
  
  if ((m.val_ & Async) == Default) {
    this = (Async *)operator_new(0x58);
    SolveStrategy((SolveStrategy *)this,m,f,algo);
  }
  else {
    this = (Async *)operator_new(0xb8);
    Async::Async(this,m,f,algo);
  }
  return &this->super_SolveStrategy;
}

Assistant:

ClaspFacade::SolveStrategy* ClaspFacade::SolveStrategy::create(SolveMode_t m, ClaspFacade& f, SolveAlgorithm& algo) {
	if ((m & SolveMode_t::Async) == 0) { return new SolveStrategy(m, f, &algo); }
#if CLASP_HAS_THREADS
	return new SolveStrategy::Async(m, f, &algo);
#else
	POTASSCO_REQUIRE(CLASP_HAS_THREADS, "Solve mode not supported!");
#endif
}